

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  stbi_uc sVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int depth;
  int iVar16;
  byte *pbVar17;
  stbi_uc *psVar18;
  byte *pbVar19;
  char *pcVar20;
  size_t sVar21;
  stbi_uc *psVar22;
  uint uVar23;
  int *piVar24;
  byte bVar25;
  stbi__uint32 raw_len_00;
  uint uVar26;
  stbi__uint16 *tc_00;
  ulong uVar27;
  int out_n;
  stbi__png *z_00;
  uint uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  stbi_uc *psVar32;
  ulong uVar33;
  long *in_FS_OFFSET;
  int local_4e4;
  ulong local_4d8;
  stbi_uc tc [3];
  ulong local_4c0;
  size_t local_498;
  stbi__uint32 raw_len;
  ulong local_460;
  stbi_uc *local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar5 = true;
  bVar8 = 0;
  uVar13 = 0;
  bVar3 = false;
  local_4c0 = 0;
  local_498 = 0;
  local_4d8 = 0;
  bVar4 = false;
  bVar6 = 0;
LAB_001b6f67:
  iVar9 = stbi__get16be(s);
  uVar10 = stbi__get16be(s);
  uVar28 = iVar9 * 0x10000 + uVar10;
  uVar11 = stbi__get16be(s);
  uVar12 = stbi__get16be(s);
  uVar12 = uVar12 | uVar11 << 0x10;
  uVar14 = (uint)local_4d8;
  uVar30 = uVar14;
  if ((int)uVar12 < 0x49484452) {
    if (uVar12 == 0x43674249) {
      bVar3 = true;
    }
    else {
      if (uVar12 == 0x49444154) {
        if ((!bVar5) && ((bVar6 == 0 || ((uint)local_4c0 != 0)))) {
          if (scan == 2) {
            if (bVar6 != 0) {
              s->img_n = (uint)bVar6;
              return 1;
            }
            return 1;
          }
          if (0x40000000 < uVar28) {
            pcVar20 = "IDAT section larger than 2^30 bytes";
            goto LAB_001b75fe;
          }
          uVar30 = uVar28 + uVar14;
          if ((int)uVar30 < (int)uVar14) {
            return 0;
          }
          if ((uint)local_498 < uVar30) {
            sVar21 = 0x1000;
            if (0x1000 < uVar28) {
              sVar21 = (ulong)uVar28;
            }
            if ((uint)local_498 != 0) {
              sVar21 = local_498;
            }
            do {
              local_498 = sVar21;
              sVar21 = (ulong)((uint)local_498 * 2);
            } while ((uint)local_498 < uVar30);
            psVar18 = (stbi_uc *)realloc(*ppsVar1,local_498);
            if (psVar18 == (stbi_uc *)0x0) goto LAB_001b7af1;
            *ppsVar1 = psVar18;
          }
          else {
            psVar18 = *ppsVar1;
          }
          iVar9 = stbi__getn(s,psVar18 + local_4d8,uVar28);
          bVar5 = false;
          if (iVar9 != 0) goto LAB_001b75c8;
        }
        goto LAB_001b75f7;
      }
      if (uVar12 == 0x49454e44) {
        if (!bVar5) {
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 != (stbi_uc *)0x0) {
            raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
            psVar18 = (stbi_uc *)
                      stbi_zlib_decode_malloc_guesssize_headerflag
                                ((char *)*ppsVar1,uVar14,raw_len,(int *)&raw_len,(uint)!bVar3);
            z->expanded = psVar18;
            if (psVar18 == (stbi_uc *)0x0) {
              return 0;
            }
            free(z->idata);
            raw_len_00 = raw_len;
            z->idata = (stbi_uc *)0x0;
            iVar9 = s->img_n + 1;
            iVar15 = s->img_n;
            if (bVar4) {
              iVar15 = iVar9;
            }
            out_n = iVar15;
            if (req_comp != 3) {
              out_n = iVar9;
            }
            if (bVar6 != 0) {
              out_n = iVar15;
            }
            if (iVar9 != req_comp) {
              out_n = iVar15;
            }
            s->img_out_n = out_n;
            uVar14 = z->depth;
            local_460 = (ulong)uVar14;
            iVar9 = out_n << (uVar14 == 0x10);
            x = z->s->img_x;
            y = z->s->img_y;
            if (bVar8 == 0) {
              iVar9 = stbi__create_png_image_raw(z,z->expanded,raw_len,out_n,x,y,uVar14,uVar13);
              if (iVar9 == 0) {
                return 0;
              }
            }
            else {
              local_458 = z->expanded;
              psVar18 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar9,0);
              if (psVar18 == (stbi_uc *)0x0) goto LAB_001b7af1;
              sVar21 = (size_t)iVar9;
              lVar31 = 0;
              do {
                psVar2 = z->s;
                uVar14 = (&DAT_002151c0)[lVar31];
                uVar30 = (&DAT_00215200)[lVar31];
                uVar26 = ~uVar14 + psVar2->img_x + uVar30;
                uVar12 = uVar26 / uVar30;
                uVar10 = (&DAT_002151e0)[lVar31];
                uVar11 = (&DAT_00215220)[lVar31];
                uVar23 = ~uVar10 + psVar2->img_y + uVar11;
                uVar28 = uVar23 / uVar11;
                if ((uVar30 <= uVar26) && (uVar11 <= uVar23)) {
                  depth = (int)local_460;
                  iVar15 = psVar2->img_n;
                  iVar16 = stbi__create_png_image_raw
                                     (z,local_458,raw_len_00,out_n,uVar12,uVar28,depth,uVar13);
                  if (iVar16 == 0) {
                    free(psVar18);
                    return 0;
                  }
                  if (0 < (int)uVar28) {
                    local_4e4 = uVar10 * iVar9;
                    local_4c0 = 0;
                    do {
                      if (0 < (int)uVar12) {
                        psVar22 = z->out;
                        psVar32 = psVar18 + (ulong)(z->s->img_x * local_4e4) +
                                            (long)(int)uVar14 * sVar21;
                        lVar29 = 0;
                        do {
                          memcpy(psVar32,psVar22 + (local_4c0 * (long)(int)uVar12 + lVar29) * sVar21
                                 ,sVar21);
                          lVar29 = lVar29 + 1;
                          psVar32 = psVar32 + (long)(int)uVar30 * sVar21;
                        } while (lVar29 < (int)uVar12);
                      }
                      local_4c0 = local_4c0 + 1;
                      local_4e4 = local_4e4 + uVar11 * iVar9;
                    } while (local_4c0 < uVar28);
                  }
                  uVar28 = (((int)(uVar12 * depth * iVar15 + 7) >> 3) + 1) * uVar28;
                  free(z->out);
                  local_458 = local_458 + uVar28;
                  raw_len_00 = raw_len_00 - uVar28;
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 != 7);
              z->out = psVar18;
            }
            if (bVar4) {
              z_00 = (stbi__png *)(ulong)z->s->img_x;
              tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
              iVar9 = (int)z->out;
              if (z->depth == 0x10) {
                stbi__compute_transparency16(z_00,tc_00,iVar9);
              }
              else {
                stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar9);
              }
            }
            if (bVar3) {
              piVar24 = &stbi__de_iphone_flag_global;
              if (*(int *)((long)in_FS_OFFSET + -0x4c) != 0) {
                piVar24 = (int *)(*in_FS_OFFSET + -0x50);
              }
              if ((*piVar24 != 0) && (2 < s->img_out_n)) {
                stbi__de_iphone((stbi__png *)z->s);
              }
            }
            if (bVar6 == 0) {
              if (bVar4) {
                s->img_n = s->img_n + 1;
              }
            }
            else {
              s->img_n = (uint)bVar6;
              uVar13 = (uint)bVar6;
              if (2 < req_comp) {
                uVar13 = req_comp;
              }
              s->img_out_n = uVar13;
              psVar18 = z->out;
              uVar14 = z->s->img_y * z->s->img_x;
              psVar22 = (stbi_uc *)stbi__malloc_mad2(uVar14,uVar13,0);
              if (psVar22 == (stbi_uc *)0x0) {
LAB_001b7af1:
                in_FS_OFFSET[-0xd] = (long)"Out of memory";
                return 0;
              }
              if (uVar13 == 3) {
                if (uVar14 != 0) {
                  uVar33 = 0;
                  psVar32 = psVar22;
                  do {
                    uVar27 = (ulong)psVar18[uVar33];
                    *psVar32 = palette[uVar27 * 4];
                    psVar32[1] = palette[uVar27 * 4 + 1];
                    psVar32[2] = palette[uVar27 * 4 + 2];
                    psVar32 = psVar32 + 3;
                    uVar33 = uVar33 + 1;
                  } while (uVar14 != uVar33);
                }
              }
              else if (uVar14 != 0) {
                uVar33 = 0;
                do {
                  *(undefined4 *)(psVar22 + uVar33 * 4) =
                       *(undefined4 *)(palette + (ulong)psVar18[uVar33] * 4);
                  uVar33 = uVar33 + 1;
                } while (uVar14 != uVar33);
              }
              free(psVar18);
              z->out = psVar22;
            }
            free(z->expanded);
            z->expanded = (stbi_uc *)0x0;
            stbi__get16be(s);
            stbi__get16be(s);
            return 1;
          }
        }
LAB_001b75f7:
        pcVar20 = "Corrupt PNG";
LAB_001b75fe:
        in_FS_OFFSET[-0xd] = (long)pcVar20;
        return 0;
      }
LAB_001b72bc:
      if (bVar5) goto LAB_001b75f7;
      bVar5 = false;
      if ((uVar11 >> 0xd & 1) == 0) {
        pcVar20 = "PNG not supported: unknown PNG chunk type";
        goto LAB_001b75fe;
      }
    }
    stbi__skip(s,uVar28);
  }
  else {
    if (uVar12 == 0x74524e53) {
      if ((bVar5) || (*ppsVar1 != (stbi_uc *)0x0)) goto LAB_001b75f7;
      if (bVar6 == 0) {
        uVar14 = s->img_n;
        if (((uVar14 & 1) != 0) && (uVar14 * 2 == uVar28)) {
          if (scan == 2) {
            s->img_n = uVar14 + 1;
            return 1;
          }
          if (z->depth == 0x10) {
            if (0 < (int)uVar14) {
              lVar31 = 0;
              do {
                iVar9 = stbi__get16be(s);
                tc16[lVar31] = (stbi__uint16)iVar9;
                lVar31 = lVar31 + 1;
              } while (lVar31 < s->img_n);
            }
          }
          else if (0 < (int)uVar14) {
            lVar31 = 0;
            do {
              iVar9 = stbi__get16be(s);
              tc[lVar31] = ""[z->depth] * (char)iVar9;
              lVar31 = lVar31 + 1;
            } while (lVar31 < s->img_n);
          }
          bVar4 = true;
          bVar5 = false;
          bVar6 = 0;
          goto LAB_001b75c8;
        }
        goto LAB_001b75f7;
      }
      if (scan == 2) {
        s->img_n = 4;
        return 1;
      }
      if (((uint)local_4c0 == 0) || ((uint)local_4c0 < uVar28)) goto LAB_001b75f7;
      bVar6 = 4;
      if (uVar28 != 0) {
        psVar18 = s->img_buffer;
        uVar33 = 0;
        do {
          if (psVar18 < s->img_buffer_end) {
LAB_001b7231:
            s->img_buffer = psVar18 + 1;
            sVar7 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              goto LAB_001b7231;
            }
            sVar7 = '\0';
          }
          palette[uVar33 * 4 + 3] = sVar7;
          uVar33 = uVar33 + 1;
        } while (uVar10 + iVar9 * 0x10000 != uVar33);
      }
    }
    else {
      if (uVar12 != 0x504c5445) {
        if (uVar12 != 0x49484452) goto LAB_001b72bc;
        if ((!bVar5) || (uVar28 != 0xd)) goto LAB_001b75f7;
        iVar9 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        s->img_x = uVar13 | iVar9 << 0x10;
        iVar9 = stbi__get16be(s);
        uVar13 = stbi__get16be(s);
        uVar13 = uVar13 | iVar9 << 0x10;
        s->img_y = uVar13;
        if ((0x1000000 < uVar13) || (0x1000000 < s->img_x)) {
          pcVar20 = "Very large image (corrupt?)";
          goto LAB_001b75fe;
        }
        pbVar17 = s->img_buffer;
        if (pbVar17 < s->img_buffer_end) {
LAB_001b705d:
          pbVar19 = pbVar17 + 1;
          s->img_buffer = pbVar19;
          bVar8 = *pbVar17;
          z->depth = (uint)bVar8;
          if ((bVar8 < 0x11) && ((0x10116U >> (bVar8 & 0x1f) & 1) != 0)) {
            if (pbVar19 < s->img_buffer_end) {
LAB_001b70a8:
              pbVar17 = pbVar19 + 1;
              s->img_buffer = pbVar17;
              bVar25 = *pbVar19;
              uVar13 = (uint)bVar25;
              if (6 < uVar13) goto LAB_001b75f7;
              pbVar19 = pbVar17;
              if (bVar25 == 3) {
                if (z->depth == 0x10) goto LAB_001b75f7;
                uVar13 = 3;
                bVar25 = 3;
                bVar6 = 3;
              }
              else if ((bVar25 & 1) != 0) goto LAB_001b75f7;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar19 = s->img_buffer;
                goto LAB_001b70a8;
              }
              bVar25 = 0;
              uVar13 = 0;
            }
            if (pbVar19 < s->img_buffer_end) {
LAB_001b74b7:
              s->img_buffer = pbVar19 + 1;
              if (*pbVar19 != 0) goto LAB_001b75f7;
            }
            else if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar19 = s->img_buffer;
              goto LAB_001b74b7;
            }
            sVar7 = stbi__get8(s);
            if ((((sVar7 != '\0') || (bVar8 = stbi__get8(s), 1 < bVar8)) ||
                (uVar14 = s->img_x, uVar14 == 0)) || (uVar10 = s->img_y, uVar10 == 0))
            goto LAB_001b75f7;
            if (bVar6 != 0) {
              s->img_n = 1;
              bVar5 = false;
              if (uVar10 <= (uint)(0x40000000 / (ulong)uVar14 >> 2)) goto LAB_001b75c8;
              goto LAB_001b75f7;
            }
            uVar11 = (3 < bVar25) + 1 + (uVar13 & 2);
            s->img_n = uVar11;
            bVar5 = false;
            bVar6 = 0;
            if ((uint)((0x40000000 / (ulong)uVar14) / (ulong)uVar11) < uVar10) {
              pcVar20 = "Image too large to decode";
              goto LAB_001b75fe;
            }
            goto LAB_001b75c8;
          }
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar17 = s->img_buffer;
            goto LAB_001b705d;
          }
          z->depth = 0;
        }
        pcVar20 = "PNG not supported: 1/2/4/8/16-bit only";
        goto LAB_001b75fe;
      }
      if (((bVar5) || (0x300 < uVar28)) ||
         (uVar14 = uVar10 * 0xaaab >> 0x11, local_4c0 = (ulong)uVar14, uVar14 * 3 != uVar28))
      goto LAB_001b75f7;
      if (2 < uVar10) {
        psVar18 = s->img_buffer;
        uVar33 = 0;
        do {
          psVar22 = s->img_buffer_end;
          if (psVar18 < psVar22) {
LAB_001b7330:
            s->img_buffer = psVar18 + 1;
            sVar7 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              psVar22 = s->img_buffer_end;
              goto LAB_001b7330;
            }
            sVar7 = '\0';
          }
          palette[uVar33 * 4] = sVar7;
          if (psVar18 < psVar22) {
LAB_001b736d:
            s->img_buffer = psVar18 + 1;
            sVar7 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              psVar22 = s->img_buffer_end;
              goto LAB_001b736d;
            }
            sVar7 = '\0';
          }
          palette[uVar33 * 4 + 1] = sVar7;
          if (psVar18 < psVar22) {
LAB_001b739f:
            s->img_buffer = psVar18 + 1;
            sVar7 = *psVar18;
            psVar18 = psVar18 + 1;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              psVar18 = s->img_buffer;
              goto LAB_001b739f;
            }
            sVar7 = '\0';
          }
          palette[uVar33 * 4 + 2] = sVar7;
          palette[uVar33 * 4 + 3] = 0xff;
          uVar33 = uVar33 + 1;
        } while (local_4c0 != uVar33);
      }
    }
    bVar5 = false;
  }
LAB_001b75c8:
  stbi__get16be(s);
  stbi__get16be(s);
  local_4d8 = (ulong)uVar30;
  goto LAB_001b6f67;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}